

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

void __thiscall glslang::TIntermediate::~TIntermediate(TIntermediate *this)

{
  pointer pcVar1;
  void *pvVar2;
  pointer pTVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->processes).processes);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_erase(&(this->includeText)._M_t,
             (_Link_type)(this->includeText)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  pcVar1 = (this->sourceText)._M_dataplus._M_p;
  paVar6 = &(this->sourceText).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->sourceFile)._M_dataplus._M_p;
  paVar6 = &(this->sourceFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::_M_erase(&(this->ioAccessed)._M_t,
             (_Link_type)(this->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  lVar7 = 0;
  do {
    pvVar2 = *(void **)((long)&this->usedIoRT[3].
                               super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&this->usedIoRT[3].
                                              super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar7) - (long)pvVar2);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x60);
  lVar7 = 0;
  do {
    pvVar2 = *(void **)((long)&this->usedIo[4].
                               super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&this->usedIo[4].
                                              super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar7) - (long)pvVar2);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x78);
  pTVar3 = (this->usedAtomics).
           super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)(this->usedAtomics).
                                 super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->usedConstantId)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->blockBackingOverrides)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->uniformLocationOverrides)._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
  ::_M_erase(&(this->bindlessImageModeCaller)._M_t,
             (_Link_type)
             (this->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
  ::_M_erase(&(this->bindlessTextureModeCaller)._M_t,
             (_Link_type)
             (this->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::_M_erase(&(this->semanticNameSet)._M_t,
             (_Link_type)
             (this->semanticNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->resourceSetBinding);
  this_00 = (this->shiftBindingForSet)._M_elems + 5;
  lVar7 = -0x120;
  do {
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_M_erase(&this_00->_M_t,
               (_Link_type)(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent);
    this_00 = this_00 + -1;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 0);
  std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::~vector(&this->xfbBuffers)
  ;
  pcVar1 = (this->atomicCounterBlockName)._M_dataplus._M_p;
  paVar6 = &(this->atomicCounterBlockName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->globalUniformBlockName)._M_dataplus._M_p;
  paVar6 = &(this->globalUniformBlockName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->requestedExtensions)._M_t,
             (_Link_type)
             (this->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var5 = (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)&this->callGraph) {
    p_Var4 = p_Var5->_M_next;
    operator_delete(p_Var5,0x68);
    p_Var5 = p_Var4;
  }
  pcVar1 = (this->entryPointMangledName)._M_dataplus._M_p;
  paVar6 = &(this->entryPointMangledName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar6) {
    operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->entryPointName)._M_dataplus._M_p;
  paVar6 = &(this->entryPointName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar6) {
    return;
  }
  operator_delete(pcVar1,paVar6->_M_allocated_capacity + 1);
  return;
}

Assistant:

explicit TIntermediate(EShLanguage l, int v = 0, EProfile p = ENoProfile) :
        language(l),
        profile(p), version(v),
        treeRoot(nullptr),
        resources(TBuiltInResource{}),
        numEntryPoints(0), numErrors(0), numPushConstants(0), recursive(false),
        invertY(false),
        dxPositionW(false),
        enhancedMsgs(false),
        debugInfo(false),
        useStorageBuffer(false),
        invariantAll(false),
        nanMinMaxClamp(false),
        depthReplacing(false),
        stencilReplacing(false),
        uniqueId(0),
        globalUniformBlockName(""),
        atomicCounterBlockName(""),
        globalUniformBlockSet(TQualifier::layoutSetEnd),
        globalUniformBlockBinding(TQualifier::layoutBindingEnd),
        atomicCounterBlockSet(TQualifier::layoutSetEnd),
        implicitThisName("@this"), implicitCounterName("@count"),
        source(EShSourceNone),
        useVulkanMemoryModel(false),
        invocations(TQualifier::layoutNotSet), vertices(TQualifier::layoutNotSet),
        inputPrimitive(ElgNone), outputPrimitive(ElgNone),
        pixelCenterInteger(false), originUpperLeft(false),texCoordBuiltinRedeclared(false),
        vertexSpacing(EvsNone), vertexOrder(EvoNone), interlockOrdering(EioNone), pointMode(false), earlyFragmentTests(false),
        postDepthCoverage(false), earlyAndLateFragmentTestsAMD(false),
        nonCoherentColorAttachmentReadEXT(false),
        nonCoherentDepthAttachmentReadEXT(false),
        nonCoherentStencilAttachmentReadEXT(false),
        depthLayout(EldNone),
        stencilLayout(ElsNone),
        hlslFunctionality1(false),
        blendEquations(0), xfbMode(false), multiStream(false),
        layoutOverrideCoverage(false),
        geoPassthroughEXT(false),
        numShaderRecordBlocks(0),
        computeDerivativeMode(LayoutDerivativeNone),
        primitives(TQualifier::layoutNotSet),
        numTaskNVBlocks(0),
        layoutPrimitiveCulling(false),
        numTaskEXTPayloads(0),
        autoMapBindings(false),
        autoMapLocations(false),
        flattenUniformArrays(false),
        useUnknownFormat(false),
        hlslOffsets(false),
        hlslIoMapping(false),
        useVariablePointers(false),
        textureSamplerTransformMode(EShTexSampTransKeep),
        needToLegalize(false),
        binaryDoubleOutput(false),
        subgroupUniformControlFlow(false),
        maximallyReconverges(false),
        usePhysicalStorageBuffer(false),
        spirvRequirement(nullptr),
        spirvExecutionMode(nullptr),
        uniformLocationBase(0),
        quadDerivMode(false), reqFullQuadsMode(false)
    {
        localSize[0] = 1;
        localSize[1] = 1;
        localSize[2] = 1;
        localSizeNotDefault[0] = false;
        localSizeNotDefault[1] = false;
        localSizeNotDefault[2] = false;
        localSizeSpecId[0] = TQualifier::layoutNotSet;
        localSizeSpecId[1] = TQualifier::layoutNotSet;
        localSizeSpecId[2] = TQualifier::layoutNotSet;
        xfbBuffers.resize(TQualifier::layoutXfbBufferEnd);
        shiftBinding.fill(0);
    }